

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O0

void __thiscall Polymerase::MoveBack(Polymerase *this)

{
  bool bVar1;
  SpeciesTracker *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_01;
  runtime_error *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Polymerase *local_10;
  Polymerase *this_local;
  
  local_10 = this;
  if ((this->super_MobileElement).start_ < 1) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Attempting to assign negative start position to Polymerase object \'",
                   &(this->super_MobileElement).name_);
    std::operator+(&local_30,&local_50,"\'.");
    std::runtime_error::runtime_error(this_02,(string *)&local_30);
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(&(this->super_MobileElement).name_,"__ribosome");
  if (bVar1) {
    this_00 = SpeciesTracker::Instance();
    this_01 = SpeciesTracker::codon_map_abi_cxx11_(this_00);
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::empty(this_01);
    if (!bVar1) {
      (this->super_MobileElement).start_ = (this->super_MobileElement).start_ + -3;
      (this->super_MobileElement).stop_ = (this->super_MobileElement).stop_ + -3;
      return;
    }
  }
  (this->super_MobileElement).start_ = (this->super_MobileElement).start_ + -1;
  (this->super_MobileElement).stop_ = (this->super_MobileElement).stop_ + -1;
  return;
}

Assistant:

void Polymerase::MoveBack() {
  if (start_ > 0) {
    if (name_ == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    start_ -= 3;
    stop_ -= 3;
    } else {
      start_--;
      stop_--;
    }
  } else {
    throw std::runtime_error(
        "Attempting to assign negative start position to Polymerase object '" +
        name_ + "'.");
  }
}